

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

JsErrorCode
WScriptJsrt::NotifyModuleReadyCallback(JsModuleRecord referencingModule,JsValueRef exceptionVar)

{
  mapped_type *pmVar1;
  ModuleMessage *message;
  JsErrorCode JVar2;
  undefined8 uVar3;
  void *local_40;
  JsValueRef specifier;
  AutoString fileName;
  JsModuleRecord referencingModule_local;
  
  fileName._24_8_ = referencingModule;
  if ((exceptionVar != (JsValueRef)0x0) && (HostConfigFlags::flags.TraceHostCallbackIsEnabled)) {
    local_40 = (JsValueRef)0x0;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetModuleHostInfo)
              (referencingModule,JsModuleHostInfo_Url,&local_40);
    fileName.data._0_5_ = 0;
    fileName._13_8_ = 0;
    specifier = (JsValueRef)0x0;
    fileName.length._0_5_ = 0;
    fileName.length._5_3_ = 0;
    if (local_40 == (JsValueRef)0x0) {
      uVar3 = 0;
    }
    else {
      AutoString::Initialize((AutoString *)&specifier,local_40);
      uVar3 = CONCAT35(fileName.length._5_3_,(undefined5)fileName.length);
    }
    PAL_wprintf(L"NotifyModuleReadyCallback(exception) %S\n",uVar3);
    AutoString::~AutoString((AutoString *)&specifier);
  }
  pmVar1 = std::
           map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
           ::operator[](&moduleErrMap,(key_type *)&fileName.errorCode);
  JVar2 = JsNoError;
  if (*pmVar1 != ErroredModule) {
    JVar2 = JsNoError;
    message = ModuleMessage::Create((JsModuleRecord)fileName._24_8_,(JsValueRef)0x0,(string *)0x0);
    if (message == (ModuleMessage *)0x0) {
      JVar2 = JsErrorOutOfMemory;
    }
    else {
      PushMessage(&message->super_MessageBase);
    }
  }
  return JVar2;
}

Assistant:

JsErrorCode WScriptJsrt::NotifyModuleReadyCallback(_In_opt_ JsModuleRecord referencingModule, _In_opt_ JsValueRef exceptionVar)
{
    if (exceptionVar != nullptr && HostConfigFlags::flags.TraceHostCallbackIsEnabled)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(referencingModule, JsModuleHostInfo_Url, &specifier);
        AutoString fileName;
        if (specifier != JS_INVALID_REFERENCE)
        {
            fileName.Initialize(specifier);
        }
        wprintf(_u("NotifyModuleReadyCallback(exception) %S\n"), fileName.GetString());
    }
    
    if (moduleErrMap[referencingModule] != ErroredModule)
    {
        WScriptJsrt::ModuleMessage* moduleMessage =
            WScriptJsrt::ModuleMessage::Create(referencingModule, nullptr);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
    }
    return JsNoError;
}